

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

repeat_at_least * toml::detail::syntax::unquoted_key(spec *s)

{
  long in_RSI;
  either *in_RDI;
  either keychar;
  undefined7 in_stack_ffffffffffffff18;
  char_type in_stack_ffffffffffffff1f;
  alpha *in_stack_ffffffffffffff20;
  character *args_2;
  repeat_at_least *this;
  alpha *args;
  either *this_00;
  scanner_base in_stack_ffffffffffffff58;
  scanner_base in_stack_ffffffffffffff60;
  undefined1 local_90 [32];
  repeat_at_least local_70;
  character local_58 [4];
  long local_10;
  
  args_2 = local_58;
  local_10 = in_RSI;
  alpha::alpha((alpha *)in_stack_ffffffffffffff60._vptr_scanner_base,
               (spec *)in_stack_ffffffffffffff58._vptr_scanner_base);
  this = &local_70;
  digit::digit((digit *)in_stack_ffffffffffffff20,
               (spec *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  args = (alpha *)(local_90 + 0x10);
  character::character((character *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
  this_00 = (either *)local_90;
  character::character((character *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
  either::
  either<toml::detail::syntax::alpha,toml::detail::syntax::digit,toml::detail::character,toml::detail::character>
            (this_00,args,(digit *)this,args_2,(character *)in_RDI);
  character::~character((character *)0x735fca);
  character::~character((character *)0x735fd4);
  digit::~digit((digit *)in_stack_ffffffffffffff20);
  alpha::~alpha(in_stack_ffffffffffffff20);
  if ((*(byte *)(local_10 + 0xf) & 1) != 0) {
    in_stack_ffffffffffffff20 = (alpha *)&stack0xffffffffffffff58;
    non_ascii_key_char::non_ascii_key_char
              ((non_ascii_key_char *)in_stack_ffffffffffffff20,
               (spec *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    either::push_back<toml::detail::syntax::non_ascii_key_char>
              ((either *)in_stack_ffffffffffffff20,
               (non_ascii_key_char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    non_ascii_key_char::~non_ascii_key_char((non_ascii_key_char *)0x736032);
  }
  repeat_at_least::repeat_at_least<toml::detail::either>(this,(size_t)args_2,in_RDI);
  either::~either((either *)in_stack_ffffffffffffff20);
  return (repeat_at_least *)in_RDI;
}

Assistant:

TOML11_INLINE repeat_at_least unquoted_key(const spec& s)
{
    auto keychar = either(
            alpha(s), digit(s), character{0x2D}, character{0x5F}
        );

    if(s.v1_1_0_allow_non_english_in_bare_keys)
    {
        keychar.push_back(non_ascii_key_char(s));
    }

    return repeat_at_least(1, std::move(keychar));
}